

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetLatestDataHokuyox(HOKUYO *pHokuyo,double *pDistances,double *pAngles)

{
  int iVar1;
  double *pAngles_local;
  double *pDistances_local;
  HOKUYO *pHokuyo_local;
  
  iVar1 = GetLatestDataHokuyo(pHokuyo,pDistances,pAngles);
  return iVar1;
}

Assistant:

HARDWAREX_API int GetLatestDataHokuyox(HOKUYO* pHokuyo, double* pDistances, double* pAngles)
{
	return GetLatestDataHokuyo(pHokuyo, pDistances, pAngles);
}